

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtilsSystemSpecific.cpp
# Opt level: O1

string * ApprovalTests::FileUtilsSystemSpecific::getCommandLineForCopy
                   (string *__return_storage_ptr__,string *source,string *destination,bool isWindows
                   )

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined7 in_register_00000009;
  long *plVar4;
  size_type *psVar5;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_50[0] = local_40;
  if ((int)CONCAT71(in_register_00000009,isWindows) == 0) {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"cp ","");
    puVar3 = (undefined8 *)::std::__cxx11::string::append((char *)local_50);
    local_d0 = &local_c0;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_c0 = *plVar2;
      lStack_b8 = puVar3[3];
    }
    else {
      local_c0 = *plVar2;
      local_d0 = (long *)*puVar3;
    }
    local_c8 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(source->_M_dataplus)._M_p);
    local_b0 = &local_a0;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_a0 = *plVar2;
      lStack_98 = puVar3[3];
    }
    else {
      local_a0 = *plVar2;
      local_b0 = (long *)*puVar3;
    }
    local_a8 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)::std::__cxx11::string::append((char *)&local_b0);
    local_90 = &local_80;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_80 = *plVar2;
      lStack_78 = puVar3[3];
    }
    else {
      local_80 = *plVar2;
      local_90 = (long *)*puVar3;
    }
    local_88 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             ::std::__cxx11::string::_M_append
                       ((char *)&local_90,(ulong)(destination->_M_dataplus)._M_p);
    local_70 = &local_60;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_60 = *plVar2;
      lStack_58 = puVar3[3];
    }
    else {
      local_60 = *plVar2;
      local_70 = (long *)*puVar3;
    }
    local_68 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar2 = (long *)::std::__cxx11::string::append((char *)&local_70);
  }
  else {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"copy /Y ","");
    plVar2 = (long *)::std::__cxx11::string::append((char *)local_50);
    local_d0 = &local_c0;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_c0 = *plVar4;
      lStack_b8 = plVar2[3];
    }
    else {
      local_c0 = *plVar4;
      local_d0 = (long *)*plVar2;
    }
    local_c8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(source->_M_dataplus)._M_p);
    local_b0 = &local_a0;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar2[3];
    }
    else {
      local_a0 = *plVar4;
      local_b0 = (long *)*plVar2;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)::std::__cxx11::string::append((char *)&local_b0);
    local_90 = &local_80;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar2[3];
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)(destination->_M_dataplus)._M_p);
    local_70 = &local_60;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar2[3];
    }
    else {
      local_60 = *plVar4;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)::std::__cxx11::string::append((char *)&local_70);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileUtilsSystemSpecific::getCommandLineForCopy(
        const std::string& source, const std::string& destination, bool isWindows)
    {
        if (isWindows)
        {
            return std::string("copy /Y ") + "\"" + source + "\" \"" + destination + "\"";
        }
        else
        {
            return std::string("cp ") + "\"" + source + "\" \"" + destination + "\"";
        }
    }